

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseDecl(Parser *this)

{
  bool bVar1;
  uint uVar2;
  StructDef *this_00;
  Value *pVVar3;
  undefined8 extraout_RAX;
  size_t minalign;
  SymbolTable<flatbuffers::Value> *this_01;
  allocator local_81;
  string local_80;
  string name;
  string dc;
  
  std::__cxx11::string::string((string *)&dc,(string *)&this->doc_comment_);
  bVar1 = IsNext(this,6);
  if (!bVar1) {
    Expect(this,5);
  }
  std::__cxx11::string::string((string *)&name,(string *)&this->attribute_);
  Expect(this,4);
  this_00 = LookupCreateStruct(this,&name);
  if (this_00->predecl != false) {
    this_00->predecl = false;
    std::__cxx11::string::_M_assign((string *)this_00);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Definition).doc_comment);
    this_00->fixed = bVar1;
    local_80._M_dataplus._M_p = (pointer)this_00;
    std::
    __remove_if<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,__gnu_cxx::__ops::_Iter_equals_val<flatbuffers::StructDef*const>>
              ((__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                )(this->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                )(this->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_equals_val<flatbuffers::StructDef_*const>)&local_80);
    (this->structs_).vec.
    super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = this_00;
    ParseMetaData(this,&this_00->super_Definition);
    std::__cxx11::string::string((string *)&local_80,"original_order",&local_81);
    this_01 = &(this_00->super_Definition).attributes;
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(this_01,&local_80);
    this_00->sortbysize = !bVar1 && pVVar3 == (Value *)0x0;
    std::__cxx11::string::~string((string *)&local_80);
    Expect(this,0x7b);
    while (this->token_ != 0x7d) {
      ParseField(this,this_00);
    }
    std::__cxx11::string::string((string *)&local_80,"force_align",&local_81);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(this_01,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1 && pVVar3 != (Value *)0x0) {
      uVar2 = atoi((pVVar3->constant)._M_dataplus._M_p);
      if (((((pVVar3->type).base_type != BASE_TYPE_INT) || (0x100 < uVar2)) ||
          (minalign = (size_t)(int)uVar2, minalign < this_00->minalign)) ||
         ((minalign + 0x1ff & minalign) != 0)) {
        std::__cxx11::string::string
                  ((string *)&local_80,
                   "force_align must be a power of two integer ranging from thestruct\'s natural alignment to 256"
                   ,&local_81);
        Error(&local_80);
        goto LAB_00112ae5;
      }
      this_00->minalign = minalign;
    }
    else {
      minalign = this_00->minalign;
    }
    StructDef::PadLastField(this_00,minalign);
    Expect(this,0x7d);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&dc);
    return;
  }
LAB_00112ae5:
  std::operator+(&local_80,"datatype already exists: ",&name);
  Error(&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&dc);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseDecl() {
  std::string dc = doc_comment_;
  bool fixed = IsNext(kTokenStruct);
  if (!fixed) Expect(kTokenTable);
  std::string name = attribute_;
  Expect(kTokenIdentifier);
  auto &struct_def = *LookupCreateStruct(name);
  if (!struct_def.predecl) Error("datatype already exists: " + name);
  struct_def.predecl = false;
  struct_def.name = name;
  struct_def.doc_comment = dc;
  struct_def.fixed = fixed;
  // Move this struct to the back of the vector just in case it was predeclared,
  // to preserve declartion order.
  remove(structs_.vec.begin(), structs_.vec.end(), &struct_def);
  structs_.vec.back() = &struct_def;
  ParseMetaData(struct_def);
  struct_def.sortbysize =
    struct_def.attributes.Lookup("original_order") == nullptr && !fixed;
  Expect('{');
  while (token_ != '}') ParseField(struct_def);
  auto force_align = struct_def.attributes.Lookup("force_align");
  if (fixed && force_align) {
    auto align = static_cast<size_t>(atoi(force_align->constant.c_str()));
    if (force_align->type.base_type != BASE_TYPE_INT ||
        align < struct_def.minalign ||
        align > 256 ||
        align & (align - 1))
      Error("force_align must be a power of two integer ranging from the"
            "struct\'s natural alignment to 256");
    struct_def.minalign = align;
  }
  struct_def.PadLastField(struct_def.minalign);
  Expect('}');
}